

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::WebSocketImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::WebSocketImpl> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Array<unsigned_char>::~Array((Array<unsigned_char> *)((long)pointer + 0x380));
    ArrayBuilder<kj::Array<unsigned_char>_>::dispose
              ((ArrayBuilder<kj::Array<unsigned_char>_> *)((long)pointer + 0x360));
    NullableValue<kj::Promise<void>_>::~NullableValue
              ((NullableValue<kj::Promise<void>_> *)((long)pointer + 0x348));
    Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage>::~Maybe
              ((Maybe<kj::(anonymous_namespace)::WebSocketImpl::ControlMessage> *)
               ((long)pointer + 0x310));
    NullableValue<kj::Exception>::~NullableValue
              ((NullableValue<kj::Exception> *)((long)pointer + 0x178));
    Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext>::~Maybe
              ((Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext> *)
               ((long)pointer + 0xe0));
    Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext>::~Maybe
              ((Maybe<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext> *)
               ((long)pointer + 0x60));
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncIoStream,_std::nullptr_t> *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x3b8);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }